

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O0

char * absl::numbers_internal::FastIntToBuffer(uint64_t i,char *buffer)

{
  undefined1 auVar1 [16];
  uint32_t i_00;
  uint uVar2;
  uint32_t i_01;
  uint uVar3;
  ulong uVar4;
  uint32_t digits;
  uint32_t mid_2;
  uint32_t top_8to9;
  uint32_t top_1to11_32;
  uint64_t top_1to11;
  char *pcStack_20;
  uint32_t u32;
  char *buffer_local;
  uint64_t i_local;
  
  if ((i & 0xffffffff) == i) {
    i_local = (uint64_t)FastIntToBuffer((uint32_t)i,buffer);
  }
  else {
    uVar4 = i / 1000000000;
    i_00 = (uint32_t)uVar4;
    uVar2 = (uint32_t)i + i_00 * -1000000000;
    if ((uVar4 & 0xffffffff) == uVar4) {
      pcStack_20 = FastIntToBuffer(i_00,buffer);
    }
    else {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar4;
      i_01 = SUB164(auVar1 / ZEXT816(100),0);
      pcStack_20 = FastIntToBuffer(i_01,buffer);
      anon_unknown_0::PutTwoDigits((ulong)(i_00 + i_01 * -100),pcStack_20);
      pcStack_20 = pcStack_20 + 2;
    }
    uVar3 = uVar2 % 10000000;
    anon_unknown_0::PutTwoDigits((ulong)(uVar2 / 10000000),pcStack_20);
    uVar2 = uVar3 % 100000;
    anon_unknown_0::PutTwoDigits((ulong)(uVar3 / 100000),pcStack_20 + 2);
    uVar3 = uVar2 % 1000;
    anon_unknown_0::PutTwoDigits((ulong)(uVar2 / 1000),pcStack_20 + 4);
    anon_unknown_0::PutTwoDigits((ulong)(uVar3 / 10),pcStack_20 + 6);
    *(undefined2 *)(pcStack_20 + 8) =
         *(undefined2 *)((anonymous_namespace)::one_ASCII_final_digits + (ulong)(uVar3 % 10) * 2);
    i_local = (uint64_t)(pcStack_20 + 9);
  }
  return (char *)i_local;
}

Assistant:

char* numbers_internal::FastIntToBuffer(uint64_t i, char* buffer) {
  uint32_t u32 = static_cast<uint32_t>(i);
  if (u32 == i) return numbers_internal::FastIntToBuffer(u32, buffer);

  // Here we know i has at least 10 decimal digits.
  uint64_t top_1to11 = i / 1000000000;
  u32 = static_cast<uint32_t>(i - top_1to11 * 1000000000);
  uint32_t top_1to11_32 = static_cast<uint32_t>(top_1to11);

  if (top_1to11_32 == top_1to11) {
    buffer = numbers_internal::FastIntToBuffer(top_1to11_32, buffer);
  } else {
    // top_1to11 has more than 32 bits too; print it in two steps.
    uint32_t top_8to9 = static_cast<uint32_t>(top_1to11 / 100);
    uint32_t mid_2 = static_cast<uint32_t>(top_1to11 - top_8to9 * 100);
    buffer = numbers_internal::FastIntToBuffer(top_8to9, buffer);
    PutTwoDigits(mid_2, buffer);
    buffer += 2;
  }

  // We have only 9 digits now, again the maximum uint32_t can handle fully.
  uint32_t digits = u32 / 10000000;  // 10,000,000
  u32 -= digits * 10000000;
  PutTwoDigits(digits, buffer);
  buffer += 2;
  digits = u32 / 100000;  // 100,000
  u32 -= digits * 100000;
  PutTwoDigits(digits, buffer);
  buffer += 2;
  digits = u32 / 1000;  // 1,000
  u32 -= digits * 1000;
  PutTwoDigits(digits, buffer);
  buffer += 2;
  digits = u32 / 10;
  u32 -= digits * 10;
  PutTwoDigits(digits, buffer);
  buffer += 2;
  memcpy(buffer, one_ASCII_final_digits[u32], 2);
  return buffer + 1;
}